

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

aspa_status aspa_table_src_remove(aspa_table *aspa_table,rtr_socket *rtr_socket,_Bool notify)

{
  long lVar1;
  aspa_store_node *paVar2;
  aspa_status aVar3;
  aspa_store_node *paVar4;
  aspa_store_node **node;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  paVar2 = aspa_table->store;
  if (rtr_socket == (rtr_socket *)0x0 || paVar2 == (aspa_store_node *)0x0) {
    node = (aspa_store_node **)0x0;
  }
  else if (paVar2->rtr_socket == rtr_socket) {
    node = &aspa_table->store;
  }
  else {
    node = (aspa_store_node **)0x0;
    do {
      paVar4 = paVar2;
      paVar2 = paVar4->next;
      if (paVar2 == (aspa_store_node *)0x0) goto LAB_001060a4;
    } while (paVar2->rtr_socket != rtr_socket);
    node = &paVar4->next;
  }
LAB_001060a4:
  if ((node == (aspa_store_node **)0x0) || (*node == (aspa_store_node *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00106104;
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    aVar3 = ASPA_SUCCESS;
  }
  else {
    aVar3 = aspa_table_remove_node(aspa_table,node,notify);
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00106104:
      __stack_chk_fail();
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&aspa_table->update_lock);
  }
  return aVar3;
}

Assistant:

aspa_status aspa_table_src_remove(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						     bool notify)
{
	pthread_rwlock_wrlock(&aspa_table->update_lock);
	pthread_rwlock_wrlock(&aspa_table->lock);

	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// Already gone
		pthread_rwlock_unlock(&(aspa_table->lock));
		return ASPA_SUCCESS;
	}

	enum aspa_status res = aspa_table_remove_node(aspa_table, node, notify);

	pthread_rwlock_unlock(&(aspa_table->lock));
	pthread_rwlock_unlock(&aspa_table->update_lock);
	return res;
}